

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O2

void randomx::generateSuperscalar(SuperscalarProgram *prog,Blake2Generator *gen)

{
  byte bVar1;
  byte bVar2;
  type tVar3;
  type tVar4;
  bool bVar5;
  SuperscalarInstructionInfo *pSVar6;
  bool bVar7;
  uint cycle;
  uint uVar8;
  uint uVar9;
  pointer pMVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  uint8_t uVar15;
  int iVar16;
  int iVar17;
  undefined1 *this;
  uint cycle_00;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  RegisterInfo *pRVar21;
  int local_978;
  uint local_970;
  int local_94c;
  int local_948;
  uint local_93c;
  uint local_938;
  int local_934;
  SuperscalarInstruction currentInstruction;
  RegisterInfo registers [8];
  type portBusy [174] [3];
  
  lVar13 = 0;
  memset(portBusy,0,0x828);
  do {
    *(undefined8 *)((long)&registers[0].latency + lVar13) = 0xffffffff00000000;
    *(undefined8 *)((long)&registers[0].lastOpPar + lVar13) = 0xffffffff;
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0x80);
  currentInstruction._34_6_ = uRam0000000000137a32;
  currentInstruction._32_2_ = DAT_00137a30;
  currentInstruction.mod_ = _DAT_00137a20;
  currentInstruction.imm32_ = DAT_00137a20_4;
  currentInstruction.opGroup_ = (SuperscalarInstructionType)uRam0000000000137a28;
  currentInstruction.opGroupPar_ = uRam0000000000137a28._4_4_;
  currentInstruction.info_ = SuperscalarInstruction::Null;
  currentInstruction.src_ = (int)DAT_00137a18;
  currentInstruction.dst_ = DAT_00137a18._4_4_;
  this = DecoderBuffer::Default;
  local_938 = 0;
  bVar5 = false;
  local_970 = 0;
  local_94c = 0;
  cycle_00 = 0;
  local_978 = 0;
  local_93c = 0;
  uVar12 = 0;
  local_934 = 0;
  local_948 = 0;
  uVar20 = 0;
LAB_001205f0:
  pRVar21 = registers;
  if (((0xa9 < cycle_00) || (bVar5)) || (0x1ff < (int)local_970)) {
    prog->asicLatencies[4] = 0;
    prog->asicLatencies[5] = 0;
    prog->asicLatencies[6] = 0;
    prog->asicLatencies[7] = 0;
    prog->asicLatencies[0] = 0;
    prog->asicLatencies[1] = 0;
    prog->asicLatencies[2] = 0;
    prog->asicLatencies[3] = 0;
    uVar20 = 0;
    uVar11 = 0;
    if (0 < (int)local_970) {
      uVar11 = (ulong)local_970;
    }
    for (; uVar11 != uVar20; uVar20 = uVar20 + 1) {
      bVar1 = prog->programBuffer[uVar20].dst;
      bVar2 = prog->programBuffer[uVar20].src;
      iVar17 = 0;
      if (bVar1 != bVar2) {
        iVar17 = prog->asicLatencies[bVar2] + 1;
      }
      iVar16 = prog->asicLatencies[bVar1] + 1;
      if (iVar16 <= iVar17) {
        iVar16 = iVar17;
      }
      prog->asicLatencies[bVar1] = iVar16;
    }
    iVar17 = 0;
    uVar20 = 0;
    for (uVar11 = 0; uVar11 != 8; uVar11 = uVar11 + 1) {
      if (iVar17 < prog->asicLatencies[uVar11]) {
        uVar20 = uVar11 & 0xffffffff;
        iVar17 = prog->asicLatencies[uVar11];
      }
      prog->cpuLatencies[uVar11] = pRVar21->latency;
      pRVar21 = pRVar21 + 1;
    }
    prog->size = local_970;
    prog->addrReg = (int)uVar20;
    prog->cpuLatency = local_938;
    prog->asicLatency = iVar17;
    prog->codeSize = local_948;
    prog->macroOps = local_934;
    prog->decodeCycles = cycle_00;
    prog->ipc = (double)local_934 / (double)(int)local_938;
    prog->mulCount = local_94c;
    return;
  }
  this = (undefined1 *)
         DecoderBuffer::fetchNext
                   ((DecoderBuffer *)this,(currentInstruction.info_)->type_,cycle_00,local_94c,gen);
  iVar17 = 0;
LAB_0012063f:
  iVar16 = iVar17 + 1;
  do {
    if (((DecoderBuffer *)this)->opsCount_ <= iVar17) goto LAB_00120a89;
    pMVar10 = ((currentInstruction.info_)->ops_).
              super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)((currentInstruction.info_)->ops_).
                            super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pMVar10) >> 5) <=
        (int)uVar20) {
      if (0x1ff < (int)local_970 || bVar5) goto LAB_00120a89;
      SuperscalarInstruction::createForSlot
                (&currentInstruction,gen,((DecoderBuffer *)this)->counts_[iVar17],
                 ((DecoderBuffer *)this)->index_,((DecoderBuffer *)this)->opsCount_ == iVar16,
                 iVar17 == 0);
      pMVar10 = ((currentInstruction.info_)->ops_).
                super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar20 = 0;
    }
    pSVar6 = currentInstruction.info_;
    iVar18 = (int)uVar20;
    uVar19 = local_93c;
    if ((int)local_93c < (int)uVar12) {
      uVar19 = uVar12;
    }
    if (pMVar10[iVar18].dependent_ == false) {
      uVar19 = uVar12;
    }
    tVar3 = pMVar10[iVar18].uop1_;
    if (tVar3 == 0) {
LAB_0012078b:
      cycle = uVar19;
      if ((int)uVar19 < 0) goto LAB_00120a7f;
    }
    else {
      tVar4 = pMVar10[iVar18].uop2_;
      if (tVar4 == 0) {
        uVar19 = scheduleUop<false>(tVar3,&portBusy,uVar19);
        goto LAB_0012078b;
      }
      do {
        if (0xad < (int)uVar19) goto LAB_00120a7f;
        cycle = scheduleUop<false>(tVar3,&portBusy,uVar19);
        uVar8 = scheduleUop<false>(tVar4,&portBusy,uVar19);
        uVar19 = uVar19 + 1;
      } while (((int)cycle < 0) || (cycle != uVar8));
    }
    uVar19 = uVar12;
    if (iVar18 == pSVar6->srcOp_) {
      for (iVar14 = 0; iVar14 != -4; iVar14 = iVar14 + -1) {
        bVar7 = SuperscalarInstruction::selectSource(&currentInstruction,cycle,&registers,gen);
        if (bVar7) {
          uVar19 = uVar12 - iVar14;
          goto LAB_001207f7;
        }
        cycle = cycle + 1;
      }
    }
    else {
LAB_001207f7:
      if (iVar18 != (currentInstruction.info_)->dstOp_) break;
      for (iVar14 = 0; iVar14 != -4; iVar14 = iVar14 + -1) {
        bVar7 = SuperscalarInstruction::selectDestination
                          (&currentInstruction,cycle,0 < local_978,&registers,gen);
        if (bVar7) {
          uVar19 = uVar19 - iVar14;
          goto LAB_00120895;
        }
        cycle = cycle + 1;
      }
    }
    uVar12 = uVar19 + 4;
    if (0xff < local_978) {
      currentInstruction.canReuse_ = (bool)(undefined1)DAT_00137a30;
      currentInstruction.groupParIsSource_ = (bool)DAT_00137a30._1_1_;
      currentInstruction.info_ = SuperscalarInstruction::Null;
      currentInstruction.src_ = (int)DAT_00137a18;
      currentInstruction.dst_ = DAT_00137a18._4_4_;
      currentInstruction.mod_ = _DAT_00137a20;
      currentInstruction.imm32_ = DAT_00137a20_4;
      currentInstruction.opGroup_ = (SuperscalarInstructionType)uRam0000000000137a28;
      currentInstruction.opGroupPar_ = uRam0000000000137a28._4_4_;
      goto LAB_00120a89;
    }
    uVar20 = (ulong)((long)((currentInstruction.info_)->ops_).
                           super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)((currentInstruction.info_)->ops_).
                          super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 5;
    local_978 = local_978 + 1;
  } while( true );
LAB_00120895:
  tVar3 = pMVar10[iVar18].uop1_;
  if (tVar3 != 0) {
    tVar4 = pMVar10[iVar18].uop2_;
    uVar8 = cycle;
    if (tVar4 != 0) {
      do {
        if (0xad < (int)uVar8) {
          local_978 = 0;
          uVar12 = uVar19;
          goto LAB_00120a7f;
        }
        cycle = scheduleUop<false>(tVar3,&portBusy,uVar8);
        uVar9 = scheduleUop<false>(tVar4,&portBusy,uVar8);
        uVar8 = uVar8 + 1;
      } while (((int)cycle < 0) || (cycle != uVar9));
      scheduleUop<true>(tVar3,&portBusy,cycle);
      scheduleUop<true>(pMVar10[iVar18].uop2_,&portBusy,cycle);
      goto LAB_0012094e;
    }
    cycle = scheduleUop<true>(tVar3,&portBusy,cycle);
  }
  if ((int)cycle < 0) goto LAB_00120ae2;
LAB_0012094e:
  local_93c = pMVar10[iVar18].latency_ + cycle;
  if (iVar18 == (currentInstruction.info_)->resultOp_) {
    registers[currentInstruction.dst_].latency = local_93c;
    registers[currentInstruction.dst_].lastOpGroup = currentInstruction.opGroup_;
    registers[currentInstruction.dst_].lastOpPar = currentInstruction.opGroupPar_;
    local_938 = local_93c;
  }
  local_948 = local_948 + pMVar10[iVar18].size_;
  uVar20 = (ulong)(iVar18 + 1U);
  local_934 = local_934 + 1;
  if (0xa9 < cycle) {
    bVar5 = true;
  }
  local_978 = 0;
  iVar17 = iVar16;
  if ((int)((ulong)((long)((currentInstruction.info_)->ops_).
                          super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)((currentInstruction.info_)->ops_).
                         super__Vector_base<randomx::MacroOp,_std::allocator<randomx::MacroOp>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 5) <= (int)(iVar18 + 1U)) {
    lVar13 = (long)(int)local_970;
    prog->programBuffer[lVar13].opcode = (char)(currentInstruction.info_)->type_;
    prog->programBuffer[lVar13].dst = (uint8_t)currentInstruction.dst_;
    uVar15 = (uint8_t)currentInstruction.src_;
    if (currentInstruction.src_ < 0) {
      uVar15 = (uint8_t)currentInstruction.dst_;
    }
    prog->programBuffer[lVar13].src = uVar15;
    prog->programBuffer[lVar13].mod = (uint8_t)currentInstruction.mod_;
    prog->programBuffer[lVar13].imm32 = currentInstruction.imm32_;
    if ((0xd < (uint)(currentInstruction.info_)->type_) ||
       (iVar16 = 1, (0x3808U >> ((currentInstruction.info_)->type_ & 0x1f) & 1) == 0)) {
      iVar16 = 0;
    }
    local_970 = local_970 + 1;
    local_94c = local_94c + iVar16;
    local_978 = 0;
  }
  goto LAB_0012063f;
LAB_00120ae2:
  local_978 = 0;
  uVar12 = uVar19;
LAB_00120a7f:
  bVar5 = true;
LAB_00120a89:
  uVar12 = uVar12 + 1;
  cycle_00 = cycle_00 + 1;
  goto LAB_001205f0;
}

Assistant:

void generateSuperscalar(SuperscalarProgram& prog, Blake2Generator& gen) {

		ExecutionPort::type portBusy[CYCLE_MAP_SIZE][3];
		memset(portBusy, 0, sizeof(portBusy));
		RegisterInfo registers[8];

		const DecoderBuffer* decodeBuffer = &DecoderBuffer::Default;
		SuperscalarInstruction currentInstruction = SuperscalarInstruction::Null;
		int macroOpIndex = 0;
		int codeSize = 0;
		int macroOpCount = 0;
		int cycle = 0;
		int depCycle = 0;
		int retireCycle = 0;
		bool portsSaturated = false;
		int programSize = 0;
		int mulCount = 0;
		int decodeCycle;
		int throwAwayCount = 0;

		//decode instructions for RANDOMX_SUPERSCALAR_LATENCY cycles or until an execution port is saturated.
		//Each decode cycle decodes 16 bytes of x86 code.
		//Since a decode cycle produces on average 3.45 macro-ops and there are only 3 ALU ports, execution ports are always
		//saturated first. The cycle limit is present only to guarantee loop termination.
		//Program size is limited to SuperscalarMaxSize instructions.
		for (decodeCycle = 0; decodeCycle < RANDOMX_SUPERSCALAR_LATENCY && !portsSaturated && programSize < SuperscalarMaxSize; ++decodeCycle) {

			//select a decode configuration
			decodeBuffer = decodeBuffer->fetchNext(currentInstruction.getType(), decodeCycle, mulCount, gen);
			if (trace) std::cout << "; ------------- fetch cycle " << cycle << " (" << decodeBuffer->getName() << ")" << std::endl;

			int bufferIndex = 0;
			
			//fill all instruction slots in the current decode buffer
			while (bufferIndex < decodeBuffer->getSize()) {
				int topCycle = cycle;

				//if we have issued all macro-ops for the current RandomX instruction, create a new instruction
				if (macroOpIndex >= currentInstruction.getInfo().getSize()) {
					if (portsSaturated || programSize >= SuperscalarMaxSize)
						break;
					//select an instruction so that the first macro-op fits into the current slot
					currentInstruction.createForSlot(gen, decodeBuffer->getCounts()[bufferIndex], decodeBuffer->getIndex(), decodeBuffer->getSize() == bufferIndex + 1, bufferIndex == 0);
					macroOpIndex = 0;
					if (trace) std::cout << "; " << currentInstruction.getInfo().getName() << std::endl;
				}
				const MacroOp& mop = currentInstruction.getInfo().getOp(macroOpIndex);
				if (trace) std::cout << mop.getName() << " ";

				//calculate the earliest cycle when this macro-op (all of its uOPs) can be scheduled for execution
				int scheduleCycle = scheduleMop<false>(mop, portBusy, cycle, depCycle);
				if (scheduleCycle < 0) {
					if (trace) std::cout << "Unable to map operation '" << mop.getName() << "' to execution port (cycle " << cycle << ")" << std::endl;
					//__debugbreak();
					portsSaturated = true;
					break;
				}

				//find a source register (if applicable) that will be ready when this instruction executes
				if (macroOpIndex == currentInstruction.getInfo().getSrcOp()) {
					int forward;
					//if no suitable operand is ready, look up to LOOK_FORWARD_CYCLES forward
					for (forward = 0; forward < LOOK_FORWARD_CYCLES && !currentInstruction.selectSource(scheduleCycle, registers, gen); ++forward) {
						if (trace) std::cout << "; src STALL at cycle " << cycle << std::endl;
						++scheduleCycle;
						++cycle;
					}
					//if no register was found, throw the instruction away and try another one
					if (forward == LOOK_FORWARD_CYCLES) {
						if (throwAwayCount < MAX_THROWAWAY_COUNT) {
							throwAwayCount++;
							macroOpIndex = currentInstruction.getInfo().getSize();
							if (trace) std::cout << "; THROW away " << currentInstruction.getInfo().getName() << std::endl;
							//cycle = topCycle;
							continue;
						}
						//abort this decode buffer
						if (trace) std::cout << "Aborting at cycle " << cycle << " with decode buffer " << decodeBuffer->getName() << " - source registers not available for operation " << currentInstruction.getInfo().getName() << std::endl;
						currentInstruction = SuperscalarInstruction::Null;
						break;
					}
					if (trace) std::cout << "; src = r" << currentInstruction.getSource() << std::endl;
				}
				//find a destination register that will be ready when this instruction executes
				if (macroOpIndex == currentInstruction.getInfo().getDstOp()) {
					int forward;
					for (forward = 0; forward < LOOK_FORWARD_CYCLES && !currentInstruction.selectDestination(scheduleCycle, throwAwayCount > 0, registers, gen); ++forward) {
						if (trace) std::cout << "; dst STALL at cycle " << cycle << std::endl;
						++scheduleCycle;
						++cycle;
					}
					if (forward == LOOK_FORWARD_CYCLES) { //throw instruction away
						if (throwAwayCount < MAX_THROWAWAY_COUNT) {
							throwAwayCount++;
							macroOpIndex = currentInstruction.getInfo().getSize();
							if (trace) std::cout << "; THROW away " << currentInstruction.getInfo().getName() << std::endl;
							//cycle = topCycle;
							continue;
						}
						//abort this decode buffer
						if (trace) std::cout << "Aborting at cycle " << cycle << " with decode buffer " << decodeBuffer->getName() << " - destination registers not available" << std::endl;
						currentInstruction = SuperscalarInstruction::Null;
						break;
					}
					if (trace) std::cout << "; dst = r" << currentInstruction.getDestination() << std::endl;
				}
				throwAwayCount = 0;

				//recalculate when the instruction can be scheduled for execution based on operand availability
				scheduleCycle = scheduleMop<true>(mop, portBusy, scheduleCycle, scheduleCycle);

				if (scheduleCycle < 0) {
					if (trace) std::cout << "Unable to map operation '" << mop.getName() << "' to execution port (cycle " << scheduleCycle << ")" << std::endl;
					portsSaturated = true;
					break;
				}

				//calculate when the result will be ready
				depCycle = scheduleCycle + mop.getLatency();

				//if this instruction writes the result, modify register information
				//  RegisterInfo.latency - which cycle the register will be ready
				//  RegisterInfo.lastOpGroup - the last operation that was applied to the register
				//  RegisterInfo.lastOpPar - the last operation source value (-1 = constant, 0-7 = register)
				if (macroOpIndex == currentInstruction.getInfo().getResultOp()) {
					int dst = currentInstruction.getDestination();
					RegisterInfo& ri = registers[dst];
					retireCycle = depCycle;
					ri.latency = retireCycle;
					ri.lastOpGroup = currentInstruction.getGroup();
					ri.lastOpPar = currentInstruction.getGroupPar();
					if (trace) std::cout << "; RETIRED at cycle " << retireCycle << std::endl;
				}
				codeSize += mop.getSize();
				bufferIndex++;
				macroOpIndex++;
				macroOpCount++;

				//terminating condition
				if (scheduleCycle >= RANDOMX_SUPERSCALAR_LATENCY) {
					portsSaturated = true;
				}
				cycle = topCycle;

				//when all macro-ops of the current instruction have been issued, add the instruction into the program
				if (macroOpIndex >= currentInstruction.getInfo().getSize()) {
					currentInstruction.toInstr(prog(programSize++));
					mulCount += isMultiplication(currentInstruction.getType());
				}
			}
			++cycle;
		}

		double ipc = (macroOpCount / (double)retireCycle);

		memset(prog.asicLatencies, 0, sizeof(prog.asicLatencies));

		//Calculate ASIC latency:
		//Assumes 1 cycle latency for all operations and unlimited parallelization.
		for (int i = 0; i < programSize; ++i) {
			Instruction& instr = prog(i);
			int latDst = prog.asicLatencies[instr.dst] + 1;
			int latSrc = instr.dst != instr.src ? prog.asicLatencies[instr.src] + 1 : 0;
			prog.asicLatencies[instr.dst] = std::max(latDst, latSrc);
		}

		//address register is the register with the highest ASIC latency
		int asicLatencyMax = 0;
		int addressReg = 0;
		for (int i = 0; i < 8; ++i) {
			if (prog.asicLatencies[i] > asicLatencyMax) {
				asicLatencyMax = prog.asicLatencies[i];
				addressReg = i;
			}
			prog.cpuLatencies[i] = registers[i].latency;
		}

		prog.setSize(programSize);
		prog.setAddressRegister(addressReg);

		prog.cpuLatency = retireCycle;
		prog.asicLatency = asicLatencyMax;
		prog.codeSize = codeSize;
		prog.macroOps = macroOpCount;
		prog.decodeCycles = decodeCycle;
		prog.ipc = ipc;
		prog.mulCount = mulCount;
		

		/*if(INFO) std::cout << "; ALU port utilization:" << std::endl;
		if (INFO) std::cout << "; (* = in use, _ = idle)" << std::endl;

		int portCycles = 0;
		for (int i = 0; i < CYCLE_MAP_SIZE; ++i) {
			std::cout << "; " << std::setw(3) << i << " ";
			for (int j = 0; j < 3; ++j) {
				std::cout << (portBusy[i][j] ? '*' : '_');
				portCycles += !!portBusy[i][j];
			}
			std::cout << std::endl;
		}*/
	}